

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O1

void CB_EVAL::parse_label(parser *p,shared_data *sd,void *v,v_array<substring> *words)

{
  substring *psVar1;
  uint64_t uVar2;
  vw_exception *this;
  shared_data *psVar3;
  stringstream __msg;
  string sStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198;
  
  psVar1 = words->_begin;
  if (0x10 < (ulong)((long)words->_end - (long)psVar1)) {
    psVar3 = (shared_data *)psVar1->end;
    uVar2 = hashstring(*psVar1,0);
    *(int *)v = (int)uVar2;
    words->_begin = words->_begin + 1;
    CB::parse_label(p,psVar3,(void *)((long)v + 8),words);
    words->_begin = words->_begin + -1;
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_198,"Evaluation can not happen without an action and an exploration",0x3e);
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cb.cc"
             ,0x111,&sStack_1c8);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void parse_label(parser* p, shared_data* sd, void* v, v_array<substring>& words)
{
  CB_EVAL::label* ld = (CB_EVAL::label*)v;

  if (words.size() < 2)
    THROW("Evaluation can not happen without an action and an exploration");

  ld->action = (uint32_t)hashstring(words[0], 0);

  words.begin()++;

  CB::parse_label(p, sd, &(ld->event), words);

  words.begin()--;
}